

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmarkdowntextedit.cpp
# Opt level: O2

void __thiscall QMarkdownTextEdit::openUrl(QMarkdownTextEdit *this,QString *urlString)

{
  QDebug *pQVar1;
  QDebug QStack_38;
  undefined4 local_30;
  undefined8 local_2c;
  undefined8 uStack_24;
  undefined4 local_1c;
  char *local_18;
  
  local_30 = 2;
  local_1c = 0;
  local_2c = 0;
  uStack_24 = 0;
  local_18 = "default";
  QMessageLogger::debug();
  pQVar1 = QDebug::operator<<(&QStack_38,"QMarkdownTextEdit ");
  pQVar1 = QDebug::operator<<(pQVar1,"openUrl");
  pQVar1 = QDebug::operator<<(pQVar1," - \'urlString\': ");
  QDebug::operator<<(pQVar1,urlString);
  QDebug::~QDebug(&QStack_38);
  QUrl::QUrl((QUrl *)&local_30,urlString,0);
  QDesktopServices::openUrl((QUrl *)&local_30);
  QUrl::~QUrl((QUrl *)&local_30);
  return;
}

Assistant:

void QMarkdownTextEdit::openUrl(const QString &urlString) {
    qDebug() << "QMarkdownTextEdit " << __func__
             << " - 'urlString': " << urlString;

    QDesktopServices::openUrl(QUrl(urlString));
}